

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_doing(Curl_easy *data,_Bool *dophase_done)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  bool bVar3;
  
  pcVar1 = data->conn;
  CVar2 = Curl_pp_statemach(data,&(pcVar1->proto).ftpc.pp,false,false);
  bVar3 = (pcVar1->proto).ftpc.state == FTP_STOP;
  *dophase_done = bVar3;
  if (CVar2 == CURLE_OK && bVar3) {
    CVar2 = ftp_dophase_done(data,false);
    return CVar2;
  }
  return CVar2;
}

Assistant:

static CURLcode ftp_doing(struct Curl_easy *data,
                          bool *dophase_done)
{
  CURLcode result = ftp_multi_statemach(data, dophase_done);

  if(result)
    DEBUGF(infof(data, "DO phase failed"));
  else if(*dophase_done) {
    result = ftp_dophase_done(data, FALSE /* not connected */);

    DEBUGF(infof(data, "DO phase is complete2"));
  }
  return result;
}